

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O0

int gray_raster_render(FT_Raster raster,FT_Raster_Params *params)

{
  FT_Outline *outline_00;
  FT_Bitmap *pFVar1;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  void *local_1e0;
  undefined1 local_1d8 [8];
  gray_TWorker worker [1];
  FT_BBox clip;
  FT_BBox cbox;
  FT_Bitmap *target_map;
  FT_Outline *outline;
  FT_Raster_Params *params_local;
  FT_Raster raster_local;
  
  outline_00 = (FT_Outline *)params->source;
  pFVar1 = params->target;
  if (raster == (FT_Raster)0x0) {
    raster_local._4_4_ = 6;
  }
  else if ((params->flags & 1U) == 0) {
    raster_local._4_4_ = 0x13;
  }
  else if (outline_00 == (FT_Outline *)0x0) {
    raster_local._4_4_ = 0x14;
  }
  else if ((outline_00->n_points == 0) || (outline_00->n_contours < 1)) {
    raster_local._4_4_ = 0;
  }
  else if ((outline_00->contours == (short *)0x0) || (outline_00->points == (FT_Vector *)0x0)) {
    raster_local._4_4_ = 0x14;
  }
  else if ((int)outline_00->n_points == outline_00->contours[outline_00->n_contours + -1] + 1) {
    memcpy(&worker[0].y,outline_00,0x28);
    if ((params->flags & 2U) == 0) {
      if (pFVar1 == (FT_Bitmap *)0x0) {
        return 6;
      }
      if ((pFVar1->width == 0) || (pFVar1->rows == 0)) {
        return 0;
      }
      if (pFVar1->buffer == (uchar *)0x0) {
        return 6;
      }
      if (pFVar1->pitch < 0) {
        worker[0].outline._32_8_ = pFVar1->buffer;
      }
      else {
        worker[0].outline._32_8_ = pFVar1->buffer + (pFVar1->rows - 1) * pFVar1->pitch;
      }
      worker[0].target.origin._0_4_ = pFVar1->pitch;
      worker[0].target.pitch = 0;
      worker[0].target._12_4_ = 0;
      worker[0].render_span = (FT_SpanFunc)0x0;
    }
    else {
      if (params->gray_spans == (FT_SpanFunc)0x0) {
        return 0;
      }
      worker[0].target._8_8_ = params->gray_spans;
      worker[0].render_span = (FT_SpanFunc)params->user;
    }
    FT_Outline_Get_CBox(outline_00,(FT_BBox *)&clip.yMax);
    if ((((clip.yMax < -0x1000000) || (0x1000000 < cbox.yMin)) || (cbox.xMin < -0x1000000)) ||
       (0x1000000 < cbox.xMax)) {
      raster_local._4_4_ = 0x14;
    }
    else {
      clip.yMax = clip.yMax >> 6;
      local_1e8 = cbox.xMin >> 6;
      local_1f0 = cbox.yMin + 0x3f >> 6;
      local_1f8 = cbox.xMax + 0x3f >> 6;
      if ((params->flags & 2U) == 0) {
        worker[0].render_span_data = (void *)0x0;
        clip.xMin = 0;
        clip.yMin = (FT_Pos)pFVar1->width;
        clip.xMax = (FT_Pos)pFVar1->rows;
      }
      else if ((params->flags & 4U) == 0) {
        worker[0].render_span_data = (void *)0xffffffffffff8000;
        clip.xMin = -0x8000;
        clip.yMin = 0x7fff;
        clip.xMax = 0x7fff;
      }
      else {
        worker[0].render_span_data = (void *)(params->clip_box).xMin;
        clip.xMin = (params->clip_box).yMin;
        clip.yMin = (params->clip_box).xMax;
        clip.xMax = (params->clip_box).yMax;
      }
      local_1e0 = (void *)clip.yMax;
      if (clip.yMax <= (long)worker[0].render_span_data) {
        local_1e0 = worker[0].render_span_data;
      }
      worker[0].ex = (TCoord)local_1e0;
      if (local_1e8 <= clip.xMin) {
        local_1e8 = clip.xMin;
      }
      worker[0].min_ex = (TCoord)local_1e8;
      if (clip.yMin <= local_1f0) {
        local_1f0 = clip.yMin;
      }
      worker[0].ey = (TCoord)local_1f0;
      if (clip.xMax <= local_1f8) {
        local_1f8 = clip.xMax;
      }
      worker[0].max_ex = (TCoord)local_1f8;
      if ((worker[0].ex < worker[0].ey) && (worker[0].min_ex < worker[0].max_ex)) {
        raster_local._4_4_ = gray_convert_glyph((gray_PWorker)local_1d8);
      }
      else {
        raster_local._4_4_ = 0;
      }
    }
  }
  else {
    raster_local._4_4_ = 0x14;
  }
  return raster_local._4_4_;
}

Assistant:

static int
  gray_raster_render( FT_Raster                raster,
                      const FT_Raster_Params*  params )
  {
    const FT_Outline*  outline    = (const FT_Outline*)params->source;
    const FT_Bitmap*   target_map = params->target;
    FT_BBox            cbox, clip;

#ifndef FT_STATIC_RASTER
    gray_TWorker  worker[1];
#endif


    if ( !raster )
      return FT_THROW( Invalid_Argument );

    /* this version does not support monochrome rendering */
    if ( !( params->flags & FT_RASTER_FLAG_AA ) )
      return FT_THROW( Invalid_Mode );

    if ( !outline )
      return FT_THROW( Invalid_Outline );

    /* return immediately if the outline is empty */
    if ( outline->n_points == 0 || outline->n_contours <= 0 )
      return 0;

    if ( !outline->contours || !outline->points )
      return FT_THROW( Invalid_Outline );

    if ( outline->n_points !=
           outline->contours[outline->n_contours - 1] + 1 )
      return FT_THROW( Invalid_Outline );

    ras.outline = *outline;

    if ( params->flags & FT_RASTER_FLAG_DIRECT )
    {
      if ( !params->gray_spans )
        return 0;

      ras.render_span      = (FT_Raster_Span_Func)params->gray_spans;
      ras.render_span_data = params->user;
    }
    else
    {
      /* if direct mode is not set, we must have a target bitmap */
      if ( !target_map )
        return FT_THROW( Invalid_Argument );

      /* nothing to do */
      if ( !target_map->width || !target_map->rows )
        return 0;

      if ( !target_map->buffer )
        return FT_THROW( Invalid_Argument );

      if ( target_map->pitch < 0 )
        ras.target.origin = target_map->buffer;
      else
        ras.target.origin = target_map->buffer
              + ( target_map->rows - 1 ) * (unsigned int)target_map->pitch;

      ras.target.pitch = target_map->pitch;

      ras.render_span      = (FT_Raster_Span_Func)NULL;
      ras.render_span_data = NULL;
    }

    FT_Outline_Get_CBox( outline, &cbox );

    /* reject too large outline coordinates */
    if ( cbox.xMin < -0x1000000L || cbox.xMax > 0x1000000L ||
         cbox.yMin < -0x1000000L || cbox.yMax > 0x1000000L )
      return FT_THROW( Invalid_Outline );

    /* truncate the bounding box to integer pixels */
    cbox.xMin = cbox.xMin >> 6;
    cbox.yMin = cbox.yMin >> 6;
    cbox.xMax = ( cbox.xMax + 63 ) >> 6;
    cbox.yMax = ( cbox.yMax + 63 ) >> 6;

    /* compute clipping box */
    if ( !( params->flags & FT_RASTER_FLAG_DIRECT ) )
    {
      /* compute clip box from target pixmap */
      clip.xMin = 0;
      clip.yMin = 0;
      clip.xMax = (FT_Pos)target_map->width;
      clip.yMax = (FT_Pos)target_map->rows;
    }
    else if ( params->flags & FT_RASTER_FLAG_CLIP )
      clip = params->clip_box;
    else
    {
      clip.xMin = -32768L;
      clip.yMin = -32768L;
      clip.xMax =  32767L;
      clip.yMax =  32767L;
    }

    /* clip to target bitmap, exit if nothing to do */
    ras.min_ex = FT_MAX( cbox.xMin, clip.xMin );
    ras.min_ey = FT_MAX( cbox.yMin, clip.yMin );
    ras.max_ex = FT_MIN( cbox.xMax, clip.xMax );
    ras.max_ey = FT_MIN( cbox.yMax, clip.yMax );

    if ( ras.max_ex <= ras.min_ex || ras.max_ey <= ras.min_ey )
      return 0;

    return gray_convert_glyph( RAS_VAR );
  }